

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void freestack(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *block;
  void *block_00;
  
  block_00 = (void *)(L->stack).offset;
  if (block_00 != (void *)0x0) {
    L->ci = &L->base_ci;
    block = (L->base_ci).next;
    (L->base_ci).next = (CallInfo *)0x0;
    if (block != (CallInfo *)0x0) {
      do {
        pCVar1 = block->next;
        luaM_free_(L,block,0x40);
        L->nci = L->nci - 1;
        block = pCVar1;
      } while (pCVar1 != (CallInfo *)0x0);
      block_00 = (void *)(L->stack).offset;
    }
    luaM_free_(L,block_00,
               ((long)(L->stack_last).p - (long)block_00) * 0x10000000 + 0x500000000 >> 0x1c &
               0xfffffffffffffff0);
    return;
  }
  return;
}

Assistant:

static void freestack (lua_State *L) {
  if (L->stack.p == NULL)
    return;  /* stack not completely built yet */
  L->ci = &L->base_ci;  /* free the entire 'ci' list */
  freeCI(L);
  lua_assert(L->nci == 0);
  luaM_freearray(L, L->stack.p, stacksize(L) + EXTRA_STACK);  /* free stack */
}